

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GenericSchemaDocument
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,ValueType *document,Ch *uri,SizeType uriLength,
          IRemoteSchemaDocumentProviderType *remoteProvider,CrtAllocator *allocator,
          PointerType *pointer,Specification *spec)

{
  SchemaType **schema;
  UriType *this_00;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_01;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *v;
  Ch *value;
  Ch noUri [1];
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_c8;
  Data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  Data local_48;
  
  this->remoteProvider_ = remoteProvider;
  this->allocator_ = allocator;
  this->typeless_ = (SchemaType *)0x0;
  this->ownAllocator_ = (CrtAllocator *)0x0;
  this->root_ = (SchemaType *)0x0;
  (this->schemaMap_).allocator_ = allocator;
  (this->schemaMap_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->schemaMap_).stack_ = (char *)0x0;
  (this->schemaMap_).stackTop_ = (char *)0x0;
  (this->schemaMap_).stackEnd_ = (char *)0x0;
  (this->schemaMap_).initialCapacity_ = 0x40;
  (this->schemaRef_).allocator_ = allocator;
  (this->schemaRef_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->schemaRef_).stack_ = (char *)0x0;
  (this->schemaRef_).stackTop_ = (char *)0x0;
  (this->schemaRef_).stackEnd_ = (char *)0x0;
  (this->schemaRef_).initialCapacity_ = 0x40;
  this_00 = &this->docId_;
  (this->uri_).data_.n = (Number)0x0;
  (this->uri_).data_.s.str = (Ch *)0x0;
  (this->docId_).uri_ = (Ch *)0x0;
  (this->docId_).base_ = (Ch *)0x0;
  (this->docId_).scheme_ = (Ch *)0x0;
  (this->docId_).auth_ = (Ch *)0x0;
  (this->docId_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->docId_).path_ = (Ch *)0x0;
  (this->docId_).query_ = (Ch *)0x0;
  (this->docId_).frag_ = (Ch *)0x0;
  (this->docId_).allocator_ = (CrtAllocator *)0x0;
  this->spec_ = *spec;
  (this->error_).data_.n = (Number)0x0;
  (this->error_).data_.s.str = (Ch *)0x0;
  (this->error_).data_.f.flags = 3;
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  if (allocator == (CrtAllocator *)0x0) {
    allocator = (CrtAllocator *)operator_new(1);
    this->allocator_ = allocator;
    this->ownAllocator_ = allocator;
  }
  noUri[0] = '\0';
  if (uri == (Ch *)0x0) {
    uri = noUri;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetString
            (&this->uri_,uri,uriLength,allocator);
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)&local_c8,&this->uri_,this->allocator_);
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::operator=(this_00,&local_c8);
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericUri(&local_c8);
  this_01 = (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
             *)malloc(0x1a8);
  this->typeless_ = this_01;
  local_c8.path_ = (Ch *)0x0;
  local_c8.query_ = (Ch *)0x0;
  local_c8.scheme_ = (Ch *)0x0;
  local_c8.auth_ = (Ch *)0x0;
  local_c8.uri_ = (Ch *)0x0;
  local_c8.base_ = (Ch *)0x0;
  local_c8.frag_._0_4_ = 0;
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)0x3000000000000;
  local_48.n = (Number)0x0;
  local_48.s.str = (Ch *)0x3000000000000;
  internal::
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  ::Schema(this_01,this,(PointerType *)&local_c8,(ValueType *)&local_78.s,(ValueType *)&local_48.s,
           this->allocator_,this_00);
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)&local_c8);
  SetSchemaSpecification(this,document);
  schema = &this->root_;
  this->root_ = this->typeless_;
  if (pointer->tokenCount_ == 0) {
    CreateSchemaRecursive(this,schema,pointer,document,document,this_00);
  }
  else {
    v = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::Get(pointer,document,(size_t *)0x0);
    if (v == (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)0x0) {
      local_68 = 0;
      uStack_60 = 0;
      local_78.n.i64 = (Number)0x0;
      local_78.s.str = (Ch *)0x0;
      local_58 = 0;
      local_50 = 0x100;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
      ::
      Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
                ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                  *)pointer,
                 (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78.s)
      ;
      local_c8.path_ = (Ch *)0x0;
      local_c8.query_ = (Ch *)0x0;
      local_c8.scheme_ = (Ch *)0x0;
      local_c8.auth_ = (Ch *)0x0;
      local_c8.uri_ = (Ch *)0x0;
      local_c8.base_ = (Ch *)0x0;
      local_c8.frag_._0_4_ = 0;
      value = GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                        ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                         &local_78.s);
      SchemaErrorValue(this,kSchemaErrorStartUnknown,(PointerType *)&local_c8,value,
                       (int)uStack_60 - (int)local_68);
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                         *)&local_c8);
      internal::Stack<rapidjson::CrtAllocator>::Destroy
                ((Stack<rapidjson::CrtAllocator> *)&local_78.s);
    }
    else {
      CreateSchema(this,schema,pointer,v,document,this_00);
    }
  }
  if (*schema != (SchemaType *)0x0) {
    internal::Stack<rapidjson::CrtAllocator>::ShrinkToFit(&this->schemaRef_);
    return;
  }
  __assert_fail("root_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                ,0x761,
                "rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>::GenericSchemaDocument(const ValueType &, const Ch *, SizeType, IRemoteSchemaDocumentProviderType *, Allocator *, const PointerType &, const Specification &) [ValueT = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

explicit GenericSchemaDocument(const ValueType& document, const Ch* uri = 0, SizeType uriLength = 0,
        IRemoteSchemaDocumentProviderType* remoteProvider = 0, Allocator* allocator = 0,
        const PointerType& pointer = PointerType(), // PR #1393
        const Specification& spec = Specification(kDraft04)) :
        remoteProvider_(remoteProvider),
        allocator_(allocator),
        ownAllocator_(),
        root_(),
        typeless_(),
        schemaMap_(allocator, kInitialSchemaMapSize),
        schemaRef_(allocator, kInitialSchemaRefSize),
        spec_(spec),
        error_(kObjectType),
        currentError_()
    {
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaDocument::GenericSchemaDocument");
        if (!allocator_)
            ownAllocator_ = allocator_ = RAPIDJSON_NEW(Allocator)();

        Ch noUri[1] = {0};
        uri_.SetString(uri ? uri : noUri, uriLength, *allocator_);
        docId_ = UriType(uri_, allocator_);

        typeless_ = static_cast<SchemaType*>(allocator_->Malloc(sizeof(SchemaType)));
        new (typeless_) SchemaType(this, PointerType(), ValueType(kObjectType).Move(), ValueType(kObjectType).Move(), allocator_, docId_);

        // Establish the schema draft or open api version.
        // We only ever look for '$schema' or 'swagger' or 'openapi' at the root of the document.
        SetSchemaSpecification(document);

        // Generate root schema, it will call CreateSchema() to create sub-schemas,
        // And call HandleRefSchema() if there are $ref.
        // PR #1393 use input pointer if supplied
        root_ = typeless_;
        if (pointer.GetTokenCount() == 0) {
            CreateSchemaRecursive(&root_, pointer, document, document, docId_);
        }
        else if (const ValueType* v = pointer.Get(document)) {
            CreateSchema(&root_, pointer, *v, document, docId_);
        }
        else {
            GenericStringBuffer<EncodingType> sb;
            pointer.StringifyUriFragment(sb);
            SchemaErrorValue(kSchemaErrorStartUnknown, PointerType(), sb.GetString(), static_cast<SizeType>(sb.GetSize() / sizeof(Ch)));
        }

        RAPIDJSON_ASSERT(root_ != 0);

        schemaRef_.ShrinkToFit(); // Deallocate all memory for ref
    }